

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

json_t * json_loadf(FILE *input,size_t flags,json_error_t *error)

{
  int iVar1;
  json_t *pjVar2;
  char *source;
  lex_t lex;
  lex_t local_98;
  
  source = "<stream>";
  if (_stdin == input) {
    source = "<stdin>";
  }
  jsonp_error_init(error,source);
  if (input == (FILE *)0x0) {
    pjVar2 = (json_t *)0x0;
    error_set(error,(lex_t *)0x0,json_error_invalid_argument,"wrong arguments");
  }
  else {
    local_98.stream.get = fgetc;
    local_98.stream.buffer[0] = '\0';
    pjVar2 = (json_t *)0x0;
    local_98.stream.buffer_pos = 0;
    local_98.stream.state = 0;
    local_98.stream.line = 1;
    local_98.stream.column = 0;
    local_98.stream.position = 0;
    local_98.stream.data = input;
    iVar1 = strbuffer_init(&local_98.saved_text);
    if (iVar1 == 0) {
      local_98.token = -1;
      local_98.flags = flags;
      pjVar2 = parse_json(&local_98,flags,error);
      lex_close(&local_98);
    }
  }
  return pjVar2;
}

Assistant:

json_t *json_loadf(FILE *input, size_t flags, json_error_t *error) {
    lex_t lex;
    const char *source;
    json_t *result;

    if (input == stdin)
        source = "<stdin>";
    else
        source = "<stream>";

    jsonp_error_init(error, source);

    if (input == NULL) {
        error_set(error, NULL, json_error_invalid_argument, "wrong arguments");
        return NULL;
    }

    if (lex_init(&lex, (get_func) fgetc, flags, input))
        return NULL;

    result = parse_json(&lex, flags, error);

    lex_close(&lex);
    return result;
}